

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_192_192_30_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x80,in_stack_ffffffffffffffe0,(uint8_t *)0x0,
                    (uint8_t *)0x0);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_30_1(void) {
  const uint8_t key[24] = {0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[24]           = {0xAB, 0xFF, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[24] = {0xA8, 0x5B, 0x82, 0x44, 0x34, 0x4A, 0x2E, 0x1B,
                                           0x10, 0xA1, 0x7B, 0xAB, 0x04, 0x30, 0x73, 0xF6,
                                           0xBB, 0x64, 0x9A, 0xE6, 0xAF, 0x65, 0x9F, 0x6F};

  return lowmc_enc(&parameters_192_192_30, key, plaintext, ciphertext_expected);
}